

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O3

Vec_Int_t * Gia_ManInsePerform(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int fVerbose)

{
  undefined1 auVar1 [16];
  int iVar2;
  Vec_Int_t *vInit;
  int *piVar3;
  Vec_Int_t *vInputs;
  int *__s;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  timespec ts;
  int Cost;
  uint local_68;
  timespec local_58;
  uint local_48;
  int local_44;
  long local_40;
  Vec_Int_t *local_38;
  long lVar16;
  
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  Gia_ManRandomW(1);
  if (fVerbose != 0) {
    pcVar6 = "";
    if (vInit0 == (Vec_Int_t *)0x0) {
      pcVar6 = "no ";
    }
    printf("Running with %d frames, %d words, and %sgiven init state.\n",(ulong)(uint)nFrames,
           (ulong)(uint)nWords,pcVar6);
  }
  local_44 = nWords;
  vInit = (Vec_Int_t *)calloc(1,0x10);
  iVar2 = p->nRegs;
  lVar12 = (long)iVar2;
  local_38 = vInit0;
  if (lVar12 < 1) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc(lVar12 * 4);
    vInit->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vInit->nCap = iVar2;
    auVar1 = _DAT_008403e0;
    lVar7 = lVar12 + -1;
    auVar13._8_4_ = (int)lVar7;
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar13 = auVar13 ^ _DAT_008403e0;
    auVar15 = _DAT_008403c0;
    auVar17 = _DAT_008403d0;
    do {
      auVar18 = auVar17 ^ auVar1;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar14 && auVar13._0_4_ < auVar18._0_4_ ||
                  iVar14 < auVar18._4_4_) & 1)) {
        *(undefined4 *)((long)piVar3 + lVar7) = 2;
      }
      if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
          auVar18._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)piVar3 + lVar7 + 4) = 2;
      }
      auVar18 = auVar15 ^ auVar1;
      iVar9 = auVar18._4_4_;
      if (iVar9 <= iVar14 && (iVar9 != iVar14 || auVar18._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)piVar3 + lVar7 + 8) = 2;
        *(undefined4 *)((long)piVar3 + lVar7 + 0xc) = 2;
      }
      lVar16 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar16 + 4;
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar16 + 4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(iVar2 + 3U >> 2) << 4 != lVar7);
  }
  vInit->nSize = iVar2;
  iVar9 = (p->vCis->nSize - iVar2) * nFrames;
  vInputs = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar14 = iVar9;
  }
  vInputs->nCap = iVar14;
  if (iVar14 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar14 << 2);
  }
  vInputs->pArray = __s;
  vInputs->nSize = iVar9;
  uVar10 = 0;
  local_40 = lVar8;
  memset(__s,0,(long)iVar9 << 2);
  iVar14 = local_44;
  if (p->pData != (void *)0x0) {
    __assert_fail("!p->pData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcInse.c"
                  ,0x21,"void Gia_ParTestAlloc(Gia_Man_t *, int)");
  }
  pvVar4 = malloc((long)p->nObjs * (long)local_44 * 0x10);
  p->pData = pvVar4;
  p->iData = iVar14;
  Gia_ManInseInit(p,vInit);
  lVar8 = local_40;
  if (0 < iVar2) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + (((uint)piVar3[lVar7] >> 1 & 1) != 0);
      lVar7 = lVar7 + 1;
    } while (lVar12 != lVar7);
  }
  if (fVerbose != 0) {
    printf("Frame =%6d : Values =%6d (out of %6d)\n",0,(ulong)uVar10,(ulong)uVar10);
  }
  if (nFrames < 1) {
    local_68 = 0;
  }
  else {
    uVar11 = 0;
    do {
      iVar2 = clock_gettime(3,&local_58);
      if (iVar2 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_58.tv_sec * -1000000;
      }
      if (0 < p->nObjs) {
        iVar2 = 0;
        do {
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManInseSimulateObj(p,iVar2);
          iVar2 = iVar2 + 1;
        } while (iVar2 < p->nObjs);
      }
      iVar2 = Gia_ManInseHighestScore(p,(int *)&local_48);
      Gia_ManInseFindStarting(p,iVar2,vInit,vInputs);
      Gia_ManInseInit(p,vInit);
      uVar11 = uVar11 + 1;
      if (fVerbose != 0) {
        printf("Frame =%6d : Values =%6d (out of %6d)   ",(ulong)uVar11,(ulong)local_48,
               (ulong)uVar10);
        iVar14 = 3;
        iVar2 = clock_gettime(3,&local_58);
        if (iVar2 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
        }
        Abc_Print(iVar14,"%s =","Time");
        Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar12 + lVar8) / 1000000.0);
      }
      lVar8 = local_40;
      local_68 = nFrames;
    } while (uVar11 != nFrames);
  }
  pVVar5 = local_38;
  if (p->pData != (void *)0x0) {
    free(p->pData);
    p->pData = (void *)0x0;
  }
  p->iData = 0;
  pVVar5 = Gia_ManInseSimulate(p,pVVar5,vInputs,vInit);
  if (vInit->pArray != (int *)0x0) {
    free(vInit->pArray);
  }
  free(vInit);
  if (vInputs->pArray != (int *)0x0) {
    free(vInputs->pArray);
  }
  free(vInputs);
  printf("After %d frames, found a sequence to produce %d x-values (out of %d).  ",(ulong)local_68,
         (ulong)local_48,(ulong)(uint)p->nRegs);
  iVar14 = 3;
  iVar2 = clock_gettime(3,&local_58);
  if (iVar2 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  Abc_Print(iVar14,"%s =","Total runtime");
  Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar12 + lVar8) / 1000000.0);
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManInsePerform( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int fVerbose )
{
    Vec_Int_t * vRes, * vInit, * vInputs;
    Gia_Obj_t * pObj;
    int i, f, iPat, Cost, Cost0;
    abctime clk, clkTotal = Abc_Clock();
    Gia_ManRandomW( 1 );
    if ( fVerbose )
        printf( "Running with %d frames, %d words, and %sgiven init state.\n", nFrames, nWords, vInit0 ? "":"no " );
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 2 );
    vInputs = Vec_IntStart( Gia_ManPiNum(p) * nFrames );
    Gia_ParTestAlloc( p, nWords );
    Gia_ManInseInit( p, vInit );
    Cost0 = 0;
    Vec_IntForEachEntry( vInit, iPat, i )
        Cost0 += ((iPat >> 1) & 1);
    if ( fVerbose )
        printf( "Frame =%6d : Values =%6d (out of %6d)\n", 0, Cost0, Cost0 );
    for ( f = 0; f < nFrames; f++ )
    {
        clk = Abc_Clock();
        Gia_ManForEachObj( p, pObj, i )
            Gia_ManInseSimulateObj( p, i );
        iPat = Gia_ManInseHighestScore( p, &Cost );
        Gia_ManInseFindStarting( p, iPat, vInit, vInputs );
        Gia_ManInseInit( p, vInit );
        if ( fVerbose )
            printf( "Frame =%6d : Values =%6d (out of %6d)   ", f+1, Cost, Cost0 );
        if ( fVerbose )
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Gia_ParTestFree( p );
    vRes = Gia_ManInseSimulate( p, vInit0, vInputs, vInit );
    Vec_IntFreeP( &vInit );
    Vec_IntFreeP( &vInputs );
    printf( "After %d frames, found a sequence to produce %d x-values (out of %d).  ", f, Cost, Gia_ManRegNum(p) );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vRes;
}